

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Function.cpp
# Opt level: O2

void __thiscall Refal2::CFunctionBuilder::AddEndOfLeft(CFunctionBuilder *this)

{
  bool bVar1;
  
  if ((this->super_CVariablesBuilder).field_0x1aac != '\0') {
    error(this,EC_ThereAreMultiplePartsSeparatorInRules);
    return;
  }
  while ((this->balanceStack).c.
         super__Deque_base<Refal2::CNode<Refal2::CUnit>_*,_std::allocator<Refal2::CNode<Refal2::CUnit>_*>_>
         ._M_impl.super__Deque_impl_data._M_finish._M_cur !=
         (this->balanceStack).c.
         super__Deque_base<Refal2::CNode<Refal2::CUnit>_*,_std::allocator<Refal2::CNode<Refal2::CUnit>_*>_>
         ._M_impl.super__Deque_impl_data._M_start._M_cur) {
    std::deque<Refal2::CNode<Refal2::CUnit>_*,_std::allocator<Refal2::CNode<Refal2::CUnit>_*>_>::
    pop_back(&(this->balanceStack).c);
    error(this,EC_UnclosedLeftParenInLeftPart);
  }
  bVar1 = CErrorsHelper::HasErrors((CErrorsHelper *)this);
  if (bVar1) {
    CNodeList<Refal2::CUnit>::Empty(&(this->acc).super_CNodeList<Refal2::CUnit>);
  }
  else {
    CNodeList<Refal2::CUnit>::Move
              (&(this->acc).super_CNodeList<Refal2::CUnit>,
               &(this->leftPart).super_CNodeList<Refal2::CUnit>);
  }
  (this->super_CVariablesBuilder).field_0x1aac = 1;
  return;
}

Assistant:

void CFunctionBuilder::AddEndOfLeft()
{
	if( isProcessRightPart ) {
		error( EC_ThereAreMultiplePartsSeparatorInRules );
	} else {
		while( !balanceStack.empty() ) {
			balanceStack.pop();
			error( EC_UnclosedLeftParenInLeftPart );
		}
		if( HasErrors() ) {
			acc.Empty();
		} else {
			acc.Move( leftPart );
		}
		isProcessRightPart = true;
	}
}